

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

bool_t hexEq_fast(void *buf,char *hex)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strLen(hex);
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if (*buf != (byte)(hex_dec_table[(byte)hex[sVar2]] << 4 | hex_dec_table[(byte)hex[sVar2 + 1]])
         ) {
        return 0;
      }
      buf = (void *)((long)buf + 1);
      sVar2 = sVar2 + 2;
    } while (sVar1 != sVar2);
  }
  return 1;
}

Assistant:

bool_t FAST(hexEq)(const void* buf, const char* hex)
{
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	for (; count; count -= 2, hex += 2, buf = (const octet*)buf + 1)
		if (*(const octet*)buf != hexToO(hex))
			return FALSE;
	return TRUE;
}